

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O0

void __thiscall
Reflection::StructImpl<Analyser::Static::Enterprise::Target>::
declare_emplace<Analyser::Static::Enterprise::Target::Speed>
          (StructImpl<Analyser::Static::Enterprise::Target> *this,Speed *t,string *name,size_t count
          )

{
  Field local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Analyser::Static::Enterprise::Target>::Field>
  local_68;
  size_t local_28;
  size_t count_local;
  string *name_local;
  Speed *t_local;
  StructImpl<Analyser::Static::Enterprise::Target> *this_local;
  
  local_28 = count;
  count_local = (size_t)name;
  name_local = (string *)t;
  t_local = (Speed *)this;
  Field::Field(&local_88,(type_info *)&Analyser::Static::Enterprise::Target::Speed::typeinfo,
               (long)t - (long)this,4,count);
  std::
  make_pair<std::__cxx11::string_const&,Reflection::StructImpl<Analyser::Static::Enterprise::Target>::Field>
            (&local_68,name,&local_88);
  std::
  unordered_map<std::__cxx11::string,Reflection::StructImpl<Analyser::Static::Enterprise::Target>::Field,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Reflection::StructImpl<Analyser::Static::Enterprise::Target>::Field>>>
  ::
  emplace<std::pair<std::__cxx11::string,Reflection::StructImpl<Analyser::Static::Enterprise::Target>::Field>>
            ((unordered_map<std::__cxx11::string,Reflection::StructImpl<Analyser::Static::Enterprise::Target>::Field,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Reflection::StructImpl<Analyser::Static::Enterprise::Target>::Field>>>
              *)&contents__abi_cxx11_,&local_68);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Analyser::Static::Enterprise::Target>::Field>
  ::~pair(&local_68);
  return;
}

Assistant:

void declare_emplace(Type *t, const std::string &name, size_t count = 1) {
			contents_.emplace(
				std::make_pair(
					name,
					Field(typeid(Type), reinterpret_cast<uint8_t *>(t) - reinterpret_cast<uint8_t *>(this), sizeof(Type), count)
				));
		}